

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zip.c
# Opt level: O0

int zip_entry_fwrite(zip_t *zip,char *filename)

{
  int iVar1;
  FILE *__stream;
  size_t bufsize;
  ushort uStack_100ca;
  undefined1 auStack_100c8 [6];
  mz_uint16 modes;
  stat file_stat;
  mz_uint8 buf [65536];
  FILE *stream;
  size_t n;
  int err;
  char *filename_local;
  zip_t *zip_local;
  
  n._4_4_ = 0;
  if (zip == (zip_t *)0x0) {
    zip_local._4_4_ = -1;
  }
  else {
    memset(file_stat.__glibc_reserved + 2,0,0x10000);
    memset(auStack_100c8,0,0x90);
    iVar1 = stat(filename,(stat *)auStack_100c8);
    if (iVar1 == 0) {
      uStack_100ca = (ushort)(uint)file_stat.st_nlink & 0xfff;
      if (((uint)file_stat.st_nlink & 0xf000) == 0x4000) {
        uStack_100ca = uStack_100ca | 0x4000;
      }
      if (((uint)file_stat.st_nlink & 0xf000) == 0x8000) {
        uStack_100ca = uStack_100ca | 0x8000;
      }
      if (((uint)file_stat.st_nlink & 0xf000) == 0xa000) {
        uStack_100ca = uStack_100ca | 0xa000;
      }
      if (((uint)file_stat.st_nlink & 0xf000) == 0x6000) {
        uStack_100ca = uStack_100ca | 0x6000;
      }
      if (((uint)file_stat.st_nlink & 0xf000) == 0x2000) {
        uStack_100ca = uStack_100ca | 0x2000;
      }
      if (((uint)file_stat.st_nlink & 0xf000) == 0x1000) {
        uStack_100ca = uStack_100ca | 0x1000;
      }
      if (((uint)file_stat.st_nlink & 0xf000) == 0xc000) {
        uStack_100ca = uStack_100ca | 0xc000;
      }
      (zip->entry).external_attr =
           (uint)uStack_100ca << 0x10 | (uint)((((uint)file_stat.st_nlink & 0x80) != 0 ^ 0xffU) & 1)
      ;
      if (((uint)file_stat.st_nlink & 0xf000) == 0x4000) {
        (zip->entry).external_attr = (zip->entry).external_attr | 0x10;
      }
      (zip->entry).m_time = file_stat.st_atim.tv_nsec;
      __stream = fopen(filename,"rb");
      if (__stream == (FILE *)0x0) {
        zip_local._4_4_ = -0x10;
      }
      else {
        do {
          bufsize = fread(file_stat.__glibc_reserved + 2,1,0x10000,__stream);
          if (bufsize == 0) goto LAB_0011fb6b;
          iVar1 = zip_entry_write(zip,file_stat.__glibc_reserved + 2,bufsize);
        } while (-1 < iVar1);
        n._4_4_ = -8;
LAB_0011fb6b:
        fclose(__stream);
        zip_local._4_4_ = n._4_4_;
      }
    }
    else {
      zip_local._4_4_ = -3;
    }
  }
  return zip_local._4_4_;
}

Assistant:

int zip_entry_fwrite(struct zip_t *zip, const char *filename) {
  int err = 0;
  size_t n = 0;
  MZ_FILE *stream = NULL;
  mz_uint8 buf[MZ_ZIP_MAX_IO_BUF_SIZE];
  struct MZ_FILE_STAT_STRUCT file_stat;
  mz_uint16 modes;

  if (!zip) {
    // zip_t handler is not initialized
    return ZIP_ENOINIT;
  }

  memset(buf, 0, MZ_ZIP_MAX_IO_BUF_SIZE);
  memset((void *)&file_stat, 0, sizeof(struct MZ_FILE_STAT_STRUCT));
  if (MZ_FILE_STAT(filename, &file_stat) != 0) {
    // problem getting information - check errno
    return ZIP_ENOENT;
  }

#if defined(_WIN32) || defined(__WIN32__) || defined(DJGPP)
  (void)modes; // unused
#else
  /* Initialize with permission bits--which are not implementation-optional */
  modes = file_stat.st_mode &
          (S_IRWXU | S_IRWXG | S_IRWXO | S_ISUID | S_ISGID | S_ISVTX);
  if (S_ISDIR(file_stat.st_mode))
    modes |= UNX_IFDIR;
  if (S_ISREG(file_stat.st_mode))
    modes |= UNX_IFREG;
  if (S_ISLNK(file_stat.st_mode))
    modes |= UNX_IFLNK;
  if (S_ISBLK(file_stat.st_mode))
    modes |= UNX_IFBLK;
  if (S_ISCHR(file_stat.st_mode))
    modes |= UNX_IFCHR;
  if (S_ISFIFO(file_stat.st_mode))
    modes |= UNX_IFIFO;
  if (S_ISSOCK(file_stat.st_mode))
    modes |= UNX_IFSOCK;
  zip->entry.external_attr = (modes << 16) | !(file_stat.st_mode & S_IWUSR);
  if ((file_stat.st_mode & S_IFMT) == S_IFDIR) {
    zip->entry.external_attr |= MZ_ZIP_DOS_DIR_ATTRIBUTE_BITFLAG;
  }
#endif

  zip->entry.m_time = file_stat.st_mtime;

  if (!(stream = MZ_FOPEN(filename, "rb"))) {
    // Cannot open filename
    return ZIP_EOPNFILE;
  }

  while ((n = fread(buf, sizeof(mz_uint8), MZ_ZIP_MAX_IO_BUF_SIZE, stream)) >
         0) {
    if (zip_entry_write(zip, buf, n) < 0) {
      err = ZIP_EWRTENT;
      break;
    }
  }
  fclose(stream);

  return err;
}